

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O0

void refreshSimpleDateTime(QDateTimeData *d)

{
  bool bVar1;
  QFlagsStorage<QDateTimePrivate::StatusFlag> flags;
  Int IVar2;
  QDateTimePrivate *pQVar3;
  Data *in_RDI;
  long in_FS_OFFSET;
  QFlags<QDateTimePrivate::StatusFlag> *unaff_retaddr;
  StatusFlags status;
  StatusFlag in_stack_ffffffffffffffdc;
  enum_type in_stack_ffffffffffffffe0;
  enum_type in_stack_ffffffffffffffe4;
  QFlagsStorage<QDateTimePrivate::StatusFlag> local_c;
  long lVar4;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  local_c.i = 0xaaaaaaaa;
  local_c.i = (Int)getStatus((QDateTimeData *)
                             CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  flags.i = (Int)operator|(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0);
  QFlags<QDateTimePrivate::StatusFlag>::testFlags
            ((QFlags<QDateTimePrivate::StatusFlag> *)&local_c,
             (QFlags<QDateTimePrivate::StatusFlag>)flags.i);
  QFlags<QDateTimePrivate::StatusFlag>::setFlag
            (unaff_retaddr,(StatusFlag)((ulong)lVar4 >> 0x20),SUB81((ulong)lVar4 >> 0x18,0));
  bVar1 = QFlags<QDateTimePrivate::StatusFlag>::testFlag
                    ((QFlags<QDateTimePrivate::StatusFlag> *)
                     CONCAT44(flags.i,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
  if (bVar1) {
    IVar2 = QFlags<QDateTimePrivate::StatusFlag>::toInt
                      ((QFlags<QDateTimePrivate::StatusFlag> *)&local_c);
    *(ulong *)in_RDI = *(ulong *)in_RDI & 0xffffffffffffff00 | (ulong)IVar2 & 0xff;
  }
  else {
    pQVar3 = QDateTime::Data::operator->(in_RDI);
    (pQVar3->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
    super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i = local_c.i;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void refreshSimpleDateTime(QDateTimeData &d)
{
    auto status = getStatus(d);
    Q_ASSERT(QTimeZone::isUtcOrFixedOffset(extractSpec(status)));
    status.setFlag(QDateTimePrivate::ValidDateTime,
                   status.testFlags(QDateTimePrivate::ValidDate | QDateTimePrivate::ValidTime));

    if (status.testFlag(QDateTimePrivate::ShortData))
        d.data.status = status.toInt();
    else
        d->m_status = status;
}